

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void chrono::turtlebot::AddLockJoint
               (shared_ptr<chrono::ChBodyAuxRef> *body_1,shared_ptr<chrono::ChBodyAuxRef> *body_2,
               shared_ptr<chrono::ChBodyAuxRef> *chassis,ChSystem *system,
               ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot)

{
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChFrame<double> *this;
  ChLinkLockLock *this_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  shared_ptr<chrono::ChLinkLockLock> revo;
  ChFrame<double> X_GC;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  ChLinkLockLock *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  ChFrame<double> local_178;
  double local_f0;
  double dStack_e8;
  double dStack_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  undefined1 local_b8 [40];
  double local_90;
  double dStack_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  this = (ChFrame<double> *)
         (**(code **)(*(long *)(chassis->
                               super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + 0x1f0))();
  local_b8._0_8_ = &PTR__ChFrame_0017db90;
  dVar1 = rel_joint_pos->m_data[2];
  auVar3._8_8_ = dVar1;
  auVar3._0_8_ = dVar1;
  auVar3._16_8_ = dVar1;
  auVar3._24_8_ = dVar1;
  auVar3 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])rel_joint_pos->m_data),auVar3,0x30);
  dVar1 = rel_joint_rot->m_data[0];
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4._16_8_ = dVar1;
  auVar4._24_8_ = dVar1;
  local_b8._8_32_ = vblendps_avx(auVar3,auVar4,0xc0);
  local_90 = rel_joint_rot->m_data[1];
  dStack_88 = rel_joint_rot->m_data[2];
  local_80 = rel_joint_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_78,rel_joint_rot);
  ChFrame<double>::operator*(&local_178,this,(ChFrame<double> *)local_b8);
  this_00 = (ChLinkLockLock *)ChLinkLock::operator_new((ChLinkLock *)0x1060,(size_t)this);
  chrono::ChLinkLockLock::ChLinkLockLock(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockLock*>
            (&_Stack_1b0,this_00);
  local_188 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_180 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var2 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_198 = (body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_190 = (body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var2 = (body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_f0 = local_178.coord.pos.m_data[0];
  dStack_e8 = local_178.coord.pos.m_data[1];
  dStack_e0 = local_178.coord.pos.m_data[2];
  dStack_d8 = local_178.coord.rot.m_data[0];
  local_d0 = local_178.coord.rot.m_data[1];
  dStack_c8 = local_178.coord.rot.m_data[2];
  local_c0 = local_178.coord.rot.m_data[3];
  (**(code **)(*(long *)this_00 + 0x250))(this_00,&local_188,&local_198);
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_180);
  }
  p_Stack_1a0 = _Stack_1b0._M_pi;
  if (_Stack_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_1b0._M_pi)->_M_use_count = (_Stack_1b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_1b0._M_pi)->_M_use_count = (_Stack_1b0._M_pi)->_M_use_count + 1;
    }
  }
  local_1a8 = this_00;
  (**(code **)(*(long *)system + 0x138))(system,&local_1a8);
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  if (_Stack_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
  }
  return;
}

Assistant:

void AddLockJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                  std::shared_ptr<ChBodyAuxRef> body_2,
                  std::shared_ptr<ChBodyAuxRef> chassis,
                  ChSystem* system,
                  const ChVector<>& rel_joint_pos,
                  const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    // auto revo = chrono_types::make_shared<ChLinkLockRevolute>();
    auto revo = chrono_types::make_shared<ChLinkLockLock>();
    revo->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(revo);
}